

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  int col;
  undefined4 uVar10;
  Matrix<float,_4,_3> res;
  Vec4 *local_b0;
  ulong local_a8;
  float local_a0 [5];
  Vector<float,_3> local_8c;
  undefined8 local_80;
  Vector<float,_3> res_1;
  undefined8 uStack_68;
  Vector<float,_3> res_2;
  float afStack_38 [2];
  Type in0;
  
  pfVar3 = afStack_38;
  pfVar4 = afStack_38;
  puVar2 = &uStack_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar8) = uVar10;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 != 0x30);
      lVar7 = lVar7 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar5 = lVar5 + 0xc;
    } while (lVar7 != 3);
    uStack_68 = *(undefined8 *)evalCtx->in[0].m_data;
    res_2.m_data[0] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    res_2.m_data[1] = (float)uVar1;
    res_2.m_data[2] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    res_2.m_data[2] = 0.0;
    uStack_68 = 0;
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    puVar6 = &s_constInMat4x3;
    lVar5 = 0;
    do {
      lVar7 = 0;
      puVar9 = puVar2;
      do {
        *(undefined4 *)puVar9 = puVar6[lVar7];
        lVar7 = lVar7 + 1;
        puVar9 = (undefined8 *)((long)puVar9 + 0xc);
      } while (lVar7 != 4);
      lVar5 = lVar5 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar6 = puVar6 + 4;
    } while (lVar5 != 3);
  }
  in0.m_data.m_data[2].m_data[0] = 0.0;
  in0.m_data.m_data[2].m_data[1] = 0.0;
  in0.m_data.m_data[2].m_data[2] = 0.0;
  in0.m_data.m_data[3].m_data[0] = 0.0;
  in0.m_data.m_data[0].m_data[2] = 0.0;
  in0.m_data.m_data[1].m_data[0] = 0.0;
  in0.m_data.m_data[1].m_data[1] = 0.0;
  in0.m_data.m_data[1].m_data[2] = 0.0;
  afStack_38[0] = 0.0;
  afStack_38[1] = 0.0;
  in0.m_data.m_data[0].m_data[0] = 0.0;
  in0.m_data.m_data[0].m_data[1] = 0.0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar5 != lVar8) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar10;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    pfVar3 = (float *)((long)pfVar3 + 4);
    lVar5 = lVar5 + 0x10;
  } while (lVar7 != 4);
  puVar2 = &uStack_68;
  lVar5 = 0;
  do {
    lVar7 = 0;
    puVar9 = puVar2;
    do {
      *(undefined4 *)((long)pfVar4 + lVar7 * 4) = *(undefined4 *)puVar9;
      lVar7 = lVar7 + 1;
      puVar9 = (undefined8 *)((long)puVar9 + 0xc);
    } while (lVar7 != 4);
    lVar5 = lVar5 + 1;
    pfVar4 = (float *)((long)pfVar4 + 0x10);
    puVar2 = (undefined8 *)((long)puVar2 + 4);
  } while (lVar5 != 3);
  res_1.m_data[1] = afStack_38[0];
  res_1.m_data[2] = afStack_38[1];
  local_80 = CONCAT44(in0.m_data.m_data[1].m_data[1],in0.m_data.m_data[1].m_data[0]);
  res_1.m_data[0] = in0.m_data.m_data[1].m_data[2];
  local_b0 = (Vec4 *)0x0;
  local_a8 = local_a8 & 0xffffffff00000000;
  lVar5 = 0;
  do {
    *(float *)((long)&local_b0 + lVar5 * 4) = res_1.m_data[lVar5 + 1] + res_1.m_data[lVar5 + -2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_8c.m_data[0] = in0.m_data.m_data[2].m_data[2];
  local_8c.m_data[1] = in0.m_data.m_data[3].m_data[0];
  local_8c.m_data[2] = in0.m_data.m_data[2].m_data[0];
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  local_a0[4] = 0.0;
  lVar5 = 0;
  do {
    local_a0[lVar5 + 2] = *(float *)((long)&local_b0 + lVar5 * 4) + local_a0[lVar5 + 5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar5 * 4)] = local_a0[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}